

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Metadata::ByteSizeLong(Metadata *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  size_type sVar2;
  int iVar3;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar4;
  size_t sVar5;
  uint uVar6;
  size_t sVar7;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar8;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *this_00;
  const_iterator it;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_58;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_40;
  
  local_58.m_ = (this->userdefined_).map_.elements_;
  uVar1 = (local_58.m_)->num_elements_;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::SearchFrom(&local_58,(local_58.m_)->index_of_first_non_null_);
  sVar7 = (uVar1 & 0xffffffff) * 2;
  local_40.node_._0_4_ = local_58.node_._0_4_;
  local_40.node_._4_4_ = local_58.node_._4_4_;
  local_40.m_._0_4_ = local_58.m_._0_4_;
  local_40.m_._4_4_ = local_58.m_._4_4_;
  local_40.bucket_index_ = local_58.bucket_index_;
  pMVar8 = (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
            *)0x0;
  while( true ) {
    if (CONCAT44(local_40.node_._4_4_,local_40.node_._0_4_) == 0) {
      if (pMVar8 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                     *)0x0) {
        (*(((MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
             *)&pMVar8->super_MessageLite)->super_MessageLite)._vptr_MessageLite[1])(pMVar8);
      }
      sVar2 = ((this->shortdescription_).ptr_)->_M_string_length;
      if (sVar2 != 0) {
        uVar6 = (uint)sVar2 | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      }
      sVar2 = ((this->versionstring_).ptr_)->_M_string_length;
      if (sVar2 != 0) {
        uVar6 = (uint)sVar2 | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      }
      sVar2 = ((this->author_).ptr_)->_M_string_length;
      if (sVar2 != 0) {
        uVar6 = (uint)sVar2 | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      }
      sVar2 = ((this->license_).ptr_)->_M_string_length;
      if (sVar2 != 0) {
        uVar6 = (uint)sVar2 | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      }
      this->_cached_size_ = (int)sVar7;
      return sVar7;
    }
    key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (CONCAT44(local_40.node_._4_4_,local_40.node_._0_4_) + 0x20);
    pMVar4 = &google::protobuf::internal::
              MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
              ::Wrap(key,key + 1,(this->userdefined_).arena_)->
              super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
    ;
    this_00 = pMVar8;
    if ((pMVar8 != pMVar4) &&
       (this_00 = pMVar4,
       pMVar8 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                  *)0x0)) {
      (*(((MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
           *)&pMVar8->super_MessageLite)->super_MessageLite)._vptr_MessageLite[1])(pMVar8);
    }
    if (this_00 ==
        (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
         *)0x0) break;
    sVar5 = google::protobuf::internal::
            MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
            ::ByteSizeLong(this_00);
    uVar6 = (uint)sVar5 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
    ::operator++(&local_40);
    pMVar8 = this_00;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5b,
                "C &google::protobuf::internal::scoped_ptr<google::protobuf::internal::MapEntryLite<std::basic_string<char>, std::basic_string<char>, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_STRING, 0>>::operator*() const [C = google::protobuf::internal::MapEntryLite<std::basic_string<char>, std::basic_string<char>, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_STRING, 0>]"
               );
}

Assistant:

size_t Metadata::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Metadata)
  size_t total_size = 0;

  // map<string, string> userDefined = 100;
  total_size += 2 *
      ::google::protobuf::internal::FromIntSize(this->userdefined_size());
  {
    ::google::protobuf::scoped_ptr<Metadata_UserDefinedEntry> entry;
    for (::google::protobuf::Map< ::std::string, ::std::string >::const_iterator
        it = this->userdefined().begin();
        it != this->userdefined().end(); ++it) {
      entry.reset(userdefined_.NewEntryWrapper(it->first, it->second));
      total_size += ::google::protobuf::internal::WireFormatLite::
          MessageSizeNoVirtual(*entry);
    }
  }

  // string shortDescription = 1;
  if (this->shortdescription().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->shortdescription());
  }

  // string versionString = 2;
  if (this->versionstring().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->versionstring());
  }

  // string author = 3;
  if (this->author().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->author());
  }

  // string license = 4;
  if (this->license().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->license());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}